

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O2

lyd_difflist * lyd_diff(lyd_node *first,lyd_node *second,int options)

{
  int *piVar1;
  undefined8 *puVar2;
  LYS_NODE LVar3;
  uint uVar4;
  lyd_difflist *plVar5;
  lyd_difflist *plVar6;
  int iVar7;
  uint uVar8;
  long *plVar9;
  ly_set *plVar10;
  ulong uVar11;
  lys_node *plVar12;
  lys_node *plVar13;
  void *pvVar14;
  ly_set *plVar15;
  LY_ERR *pLVar16;
  lys_ext *plVar17;
  ulong uVar18;
  ulong uVar19;
  LYD_DIFFTYPE *pLVar20;
  lyd_node **pplVar21;
  lys_node **pplVar22;
  undefined8 uVar23;
  long lVar24;
  long lVar25;
  lyd_node *plVar26;
  lys_ext *plVar27;
  char *format;
  lyd_node *plVar28;
  lyd_node *plVar29;
  lyd_node *plVar30;
  lyd_node *plVar31;
  lyd_node *plVar32;
  size_t __n;
  long *plVar33;
  bool bVar34;
  lys_node *plStack_98;
  char *str1;
  lys_node *local_88;
  uint local_7c;
  lyd_node *plStack_78;
  uint size2;
  lyd_node *local_70;
  ulong local_68;
  lyd_node *local_60;
  lyd_difflist *local_58;
  long *local_50;
  ulong local_48;
  lyd_difflist *local_40;
  uint local_38;
  uint local_34;
  uint size;
  
  local_34 = options;
  if (first == (lyd_node *)0x0) {
    if ((second == (lyd_node *)0x0) || (second->parent == (lyd_node *)0x0)) {
      local_40 = lyd_diff_init_difflist(&local_38);
      local_58 = (lyd_difflist *)0x0;
      uVar8 = 0;
      do {
        if (second == (lyd_node *)0x0) {
          return local_40;
        }
        if (((local_34 & 1) != 0) || ((second->field_0x9 & 1) == 0)) {
          iVar7 = lyd_difflist_add(local_40,&local_38,uVar8,LYD_DIFF_CREATED,(lyd_node *)0x0,second)
          ;
          if (iVar7 != 0) goto LAB_00159003;
          uVar8 = uVar8 + 1;
        }
        if ((local_34 >> 0xb & 1) != 0) {
          return local_40;
        }
        second = second->next;
      } while( true );
    }
    pLVar16 = ly_errno_location();
    *pLVar16 = LY_EINVAL;
    format = "%s: \"first\" parameter is NULL and \"second\" is not top level.";
    goto LAB_001596d4;
  }
  if (second == (lyd_node *)0x0) {
    local_40 = lyd_diff_init_difflist(&local_38);
    local_58 = (lyd_difflist *)0x0;
    uVar8 = 0;
    do {
      if (first == (lyd_node *)0x0) {
        return local_40;
      }
      if (((local_34 & 1) != 0) || ((first->field_0x9 & 1) == 0)) {
        iVar7 = lyd_difflist_add(local_40,&local_38,uVar8,LYD_DIFF_DELETED,first,(lyd_node *)0x0);
        if (iVar7 != 0) goto LAB_00159003;
        uVar8 = uVar8 + 1;
      }
      if ((local_34 >> 0xb & 1) != 0) {
        return local_40;
      }
      first = first->next;
    } while( true );
  }
  if (((uint)options >> 0xb & 1) == 0) {
    if (first->parent == (lyd_node *)0x0) {
      do {
        plVar28 = first;
        first = plVar28->prev;
      } while (plVar28->prev->next != (lyd_node *)0x0);
    }
    else {
      plVar28 = first->parent->child;
    }
    if (second->parent == (lyd_node *)0x0) {
      do {
        plVar31 = second;
        second = plVar31->prev;
      } while (plVar31->prev->next != (lyd_node *)0x0);
    }
    else {
      plVar31 = second->parent->child;
    }
    plVar26 = plVar31->parent;
    if (plVar28->parent == (lyd_node *)0x0) {
      if (plVar26 != (lyd_node *)0x0) goto LAB_00159013;
    }
    else if ((plVar26 != (lyd_node *)0x0) && (plVar28->parent->schema != plVar26->schema)) {
LAB_00159013:
      pLVar16 = ly_errno_location();
      *pLVar16 = LY_EINVAL;
      format = "%s: incompatible trees with different parents.";
      goto LAB_001596d4;
    }
  }
  else {
    if (first->schema != second->schema) {
      pLVar16 = ly_errno_location();
      *pLVar16 = LY_EINVAL;
      format = "%s: incompatible trees to compare with LYD_OPT_NOSIBLINGS option.";
      goto LAB_001596d4;
    }
    plVar28 = first->child;
    plVar31 = second->child;
  }
  if (plVar28 == plVar31) {
    pLVar16 = ly_errno_location();
    *pLVar16 = LY_EINVAL;
    format = "%s: comparing the same tree does not make sense.";
LAB_001596d4:
    ly_log(LY_LLERR,format,"lyd_diff");
    return (lyd_difflist *)0x0;
  }
  local_40 = lyd_diff_init_difflist(&local_38);
  local_58 = lyd_diff_init_difflist(&local_7c);
  plVar9 = (long *)malloc(0x18);
  *(undefined4 *)(plVar9 + 2) = 0;
  plVar10 = ly_set_new();
  plVar9[1] = (long)plVar10;
  *plVar9 = 0;
  plVar10 = ly_set_new();
  local_34 = local_34 & 1;
  local_48 = 0;
  plStack_78 = (lyd_node *)0x0;
  local_68 = 0;
  plVar26 = plVar28;
  plVar30 = plVar31;
LAB_001590a6:
  plVar33 = plVar9;
  if (plVar30 == (lyd_node *)0x0) goto LAB_0015973e;
  local_70 = plVar26;
  local_50 = plVar9;
  if ((local_34 == 0) && ((plVar30->field_0x9 & 1) != 0)) goto LAB_00159353;
  for (; plVar33 = local_50, plVar26 != (lyd_node *)0x0; plVar26 = plVar26->next) {
    if (plVar26->schema == plVar30->schema) {
      plVar29 = (lyd_node *)plVar9[1];
      plStack_98 = (lys_node *)0x0;
      local_88 = (lys_node *)0x0;
      if ((local_34 != 0) || ((plVar26->field_0x9 & 1) == 0)) {
        LVar3 = plVar26->schema->nodetype;
        if ((LVar3 != LYS_LEAFLIST) && (LVar3 != LYS_LIST)) {
          if (LVar3 == LYS_CONTAINER) goto LAB_00159338;
          if (LVar3 == LYS_LEAF) {
            if ((plVar26->child == plVar30->child) &&
               ((local_34 == 0 || (((plVar26->field_0x9 ^ plVar30->field_0x9) & 1) == 0))))
            goto LAB_0015934f;
          }
          else {
            if ((LVar3 != LYS_ANYXML) && (LVar3 != LYS_ANYDATA)) {
              pLVar16 = ly_errno_location();
              *pLVar16 = LY_EINT;
              uVar23 = 0xa24;
              goto LAB_0015995b;
            }
            plVar12 = plVar26[1].schema;
            if (plVar12 == (lys_node *)0x0) {
              lyxml_print_mem((char **)&plStack_98,(lyxml_elem *)0x0,0x10);
              plVar12 = (lys_node *)
                        lydict_insert_zc(plVar26->schema->module->ctx,(char *)plStack_98);
              plVar26[1].schema = plVar12;
            }
            plVar13 = plVar30[1].schema;
            plStack_98 = plVar12;
            if (plVar13 == (lys_node *)0x0) {
              lyxml_print_mem((char **)&local_88,(lyxml_elem *)0x0,0x10);
              plVar13 = (lys_node *)lydict_insert_zc(plVar30->schema->module->ctx,(char *)local_88);
              plVar30[1].schema = plVar13;
            }
            local_88 = plVar13;
            if (plStack_98 == plVar13) goto LAB_0015934f;
          }
          iVar7 = lyd_difflist_add(local_40,&local_38,(uint)local_48,LYD_DIFF_CHANGED,plVar26,
                                   plVar30);
          plVar9 = plVar33;
          if (iVar7 != 0) goto LAB_00159a92;
          local_48 = (ulong)((int)local_48 + 1);
          goto LAB_0015934f;
        }
        iVar7 = lyd_list_equal(plVar26,plVar30,0,local_34,0);
        if (iVar7 != 0) {
          if (iVar7 == -1) goto LAB_00159a92;
          plVar12 = plVar26->schema;
          if ((plVar12->flags & 0x100) == 0) goto LAB_00159338;
          uVar8 = plVar10->number;
          uVar11 = 0;
          goto LAB_0015914f;
        }
      }
    }
  }
  plVar26 = plStack_78;
  if (local_70 != (lyd_node *)0x0) {
    plVar26 = local_70->parent;
  }
  uVar8 = (uint)local_68;
  iVar7 = lyd_difflist_add(local_58,&local_7c,uVar8,LYD_DIFF_CREATED,plVar26,plVar30);
  if (iVar7 != 0) goto LAB_00159a92;
  uVar8 = uVar8 + 1;
  if ((local_70 != (lyd_node *)0x0) && (plVar26 = plVar30, (plVar30->schema->flags & 0x100) != 0)) {
    do {
      plVar26 = plVar26->prev;
      if (plVar26->next == (lyd_node *)0x0) {
        plVar26 = (lyd_node *)0x0;
        break;
      }
    } while (plVar26->schema != plVar30->schema);
    iVar7 = lyd_difflist_add(local_58,&local_7c,uVar8,LYD_DIFF_MOVEDAFTER2,plVar26,plVar30);
    if (iVar7 != 0) goto LAB_00159a92;
    uVar8 = (int)local_68 + 2;
  }
  local_68 = (ulong)uVar8;
  plVar33 = plVar9;
  goto LAB_00159353;
LAB_00159003:
  plVar9 = (long *)0x0;
  plVar10 = (ly_set *)0x0;
  goto LAB_00159a92;
LAB_0015914f:
  local_60 = plVar29;
  if (uVar8 == uVar11) goto LAB_001592f6;
  pplVar22 = (plVar10->set).s;
  if (((lys_node *)pplVar22[uVar11]->name == plVar12) &&
     (plVar32 = plVar26->parent, (lyd_node *)pplVar22[uVar11]->dsc == plVar32)) {
    if (uVar8 == (uint)uVar11) goto LAB_001592fa;
    goto LAB_0015932d;
  }
  uVar11 = uVar11 + 1;
  goto LAB_0015914f;
LAB_001592f6:
  plVar32 = plVar26->parent;
LAB_001592fa:
  plVar9 = (long *)calloc(1,0x30);
  *plVar9 = (long)plVar12;
  plVar9[1] = (long)plVar32;
  ly_set_add(plVar10,plVar9,1);
  pplVar22 = (plVar10->set).s;
  uVar11 = (ulong)uVar8;
LAB_0015932d:
  *(int *)&pplVar22[uVar11]->ref = *(int *)&pplVar22[uVar11]->ref + 1;
  plVar29 = local_60;
LAB_00159338:
  plVar30->validity = plVar30->validity | 0x80;
  ly_set_add((ly_set *)plVar29,plVar26,1);
  plVar33 = local_50;
LAB_0015934f:
  plVar26->validity = plVar26->validity | 0x80;
LAB_00159353:
  plVar29 = plVar30->next;
  plVar26 = local_70;
  if (plVar29 == (lyd_node *)0x0) {
    uVar11 = (ulong)plVar10->number;
    while ((bVar34 = uVar11 != 0, uVar11 = uVar11 - 1, bVar34 &&
           (plVar12 = (plVar10->set).s[uVar11], lVar24._0_2_ = plVar12->flags,
           lVar24._2_1_ = plVar12->ext_size, lVar24._3_1_ = plVar12->iffeature_size,
           lVar24._4_1_ = plVar12->padding[0], lVar24._5_1_ = plVar12->padding[1],
           lVar24._6_1_ = plVar12->padding[2], lVar24._7_1_ = plVar12->padding[3], lVar24 == 0))) {
      pvVar14 = calloc((ulong)*(uint *)&plVar12->ref,0x18);
      *(void **)&plVar12->flags = pvVar14;
      plVar12->ext = (lys_ext_instance **)0x0;
      *(undefined4 *)&plVar12->ref = 0;
    }
    plVar26 = plVar31;
    plVar32 = plVar31;
    if (plVar30->parent != plVar31->parent) {
      plVar26 = plVar30->parent->child;
      plVar32 = plVar26;
    }
    for (; plVar26 != (lyd_node *)0x0; plVar26 = plVar26->next) {
      if ((char)plVar26->validity < '\0') {
        if ((int)plVar33[2] == *(int *)(plVar33[1] + 4)) {
          if (plVar26 != plVar32) {
            pLVar16 = ly_errno_location();
            *pLVar16 = LY_EINT;
            uVar23 = 0xb80;
            goto LAB_0015995b;
          }
          break;
        }
        plVar26->validity = plVar26->validity & 0x7f;
        if (((plVar26->schema->nodetype & (LYS_LIST|LYS_LEAFLIST)) != LYS_UNKNOWN) &&
           ((plVar26->schema->flags & 0x100) != 0)) {
          uVar11 = (ulong)plVar10->number;
          do {
            bVar34 = uVar11 == 0;
            uVar11 = uVar11 - 1;
            if (bVar34) goto LAB_00159436;
            plVar12 = (plVar10->set).s[uVar11];
          } while (((lys_node *)plVar12->name != plVar26->schema) ||
                  (iVar7 = lyd_diff_equivnode((lyd_node *)plVar12->dsc,plVar26->parent), iVar7 == 0)
                  );
          lyd_diff_move_preprocess
                    ((diff_ordered *)plVar12,
                     *(lyd_node **)(*(long *)(local_50[1] + 8) + (ulong)*(uint *)(local_50 + 2) * 8)
                     ,plVar26);
        }
LAB_00159436:
        plVar33 = local_50;
        plVar12 = plVar26->schema;
        if ((plVar12->nodetype & (LYS_LIST|LYS_CONTAINER)) == LYS_UNKNOWN) {
          uVar8 = *(uint *)(local_50 + 2);
        }
        else {
          plVar29 = plVar26->child;
          uVar8 = *(uint *)(local_50 + 2);
          uVar11 = (ulong)uVar8;
          if (plVar29 != (lyd_node *)0x0) {
            lVar24 = local_50[1];
            uVar4 = *(uint *)(lVar24 + 4);
            uVar18 = (ulong)uVar8;
            if (uVar8 <= uVar4) {
              uVar18 = (ulong)uVar4;
            }
            goto LAB_0015962b;
          }
        }
        *(uint *)(local_50 + 2) = uVar8 + 1;
      }
    }
    if (plVar32 == plVar31) goto LAB_0015973e;
    plVar29 = (lyd_node *)0x0;
    plVar26 = local_70;
    plVar30 = plVar32;
  }
LAB_00159494:
  do {
    local_50 = plVar33;
    local_60 = plVar30;
    plVar30 = plVar29;
    plVar9 = local_50;
    if (plVar29 != (lyd_node *)0x0) goto LAB_001590a6;
    if (local_50[1] != 0) {
      *(undefined4 *)(local_50[1] + 4) = 0;
    }
    *(undefined4 *)(local_50 + 2) = 0;
    lVar24 = *local_50;
    plVar30 = local_60->parent;
    local_70 = plVar26;
    while (plVar33 = local_50, plVar30 = plVar30->next, plVar30 != (lyd_node *)0x0) {
      if ((char)plVar30->validity < '\0') {
        if (*(int *)(lVar24 + 0x10) == *(int *)(*(long *)(lVar24 + 8) + 4)) {
          local_60 = local_60->parent;
          if (plVar30 == local_60->next) goto LAB_001595e9;
          pLVar16 = ly_errno_location();
          *pLVar16 = LY_EINT;
          uVar23 = 0xbcd;
          goto LAB_0015972e;
        }
        plVar30->validity = plVar30->validity & 0x7f;
        if (((plVar30->schema->nodetype & (LYS_LIST|LYS_LEAFLIST)) != LYS_UNKNOWN) &&
           ((plVar30->schema->flags & 0x100) != 0)) {
          uVar11 = (ulong)plVar10->number;
          do {
            bVar34 = uVar11 == 0;
            uVar11 = uVar11 - 1;
            if (bVar34) goto LAB_0015953f;
            plVar12 = (plVar10->set).s[uVar11];
          } while (((lys_node *)plVar12->name != plVar30->schema) ||
                  (iVar7 = lyd_diff_equivnode((lyd_node *)plVar12->dsc,plVar30->parent), iVar7 == 0)
                  );
          lyd_diff_move_preprocess
                    ((diff_ordered *)plVar12,
                     *(lyd_node **)
                      (*(long *)(*(long *)(lVar24 + 8) + 8) + (ulong)*(uint *)(lVar24 + 0x10) * 8),
                     plVar30);
        }
LAB_0015953f:
        plVar12 = plVar30->schema;
        if ((plVar12->nodetype & (LYS_LIST|LYS_CONTAINER)) == LYS_UNKNOWN) {
          uVar8 = *(uint *)(lVar24 + 0x10);
        }
        else {
          plVar29 = plVar30->child;
          uVar8 = *(uint *)(lVar24 + 0x10);
          uVar11 = (ulong)uVar8;
          if (plVar29 != (lyd_node *)0x0) {
            lVar25 = *(long *)(lVar24 + 8);
            uVar4 = *(uint *)(lVar25 + 4);
            uVar18 = (ulong)uVar8;
            if (uVar8 <= uVar4) {
              uVar18 = (ulong)uVar4;
            }
            goto LAB_00159574;
          }
        }
        *(uint *)(lVar24 + 0x10) = uVar8 + 1;
      }
    }
    local_60 = local_60->parent;
LAB_001595e9:
    ly_set_free((ly_set *)local_50[1]);
    plVar9 = (long *)*plVar33;
    free(plVar33);
    plVar29 = (lyd_node *)0x0;
    plVar26 = local_70;
    plVar30 = local_60;
    plVar33 = plVar9;
  } while (*plVar9 != 0);
  plVar30 = (lyd_node *)0x0;
  goto LAB_001590a6;
LAB_0015962b:
  uVar8 = (uint)uVar18;
  if (uVar4 <= uVar11) goto LAB_00159648;
  if ((lys_node *)**(long **)(*(long *)(lVar24 + 8) + uVar11 * 8) == plVar12) {
    uVar8 = (uint)uVar11;
    goto LAB_00159648;
  }
  uVar11 = uVar11 + 1;
  *(int *)(local_50 + 2) = (int)uVar11;
  goto LAB_0015962b;
LAB_00159648:
  if (uVar8 == uVar4) {
    pLVar16 = ly_errno_location();
    *pLVar16 = LY_EINT;
    uVar23 = 0xb99;
LAB_0015995b:
    ly_log(LY_LLERR,"Internal error (%s:%d).",
           "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
           ,uVar23);
    plVar9 = plVar33;
    goto LAB_00159a92;
  }
  plVar26 = *(lyd_node **)(*(long *)(lVar24 + 8) + (ulong)uVar8 * 8);
  local_70 = plVar26->child;
  if (local_70 == (lyd_node *)0x0) {
    plStack_78 = plVar26;
  }
  *(uint *)(local_50 + 2) = uVar8 + 1;
  plVar9 = (long *)malloc(0x18);
  *(undefined4 *)(plVar9 + 2) = 0;
  plVar15 = ly_set_new();
  plVar9[1] = (long)plVar15;
  *plVar9 = (long)plVar33;
  plVar26 = local_70;
  plVar30 = plVar32;
  plVar33 = plVar9;
  goto LAB_00159494;
LAB_00159574:
  uVar8 = (uint)uVar18;
  if (uVar4 <= uVar11) goto LAB_00159591;
  if ((lys_node *)**(undefined8 **)(*(long *)(lVar25 + 8) + uVar11 * 8) == plVar12) {
    uVar8 = (uint)uVar11;
    goto LAB_00159591;
  }
  uVar11 = uVar11 + 1;
  *(int *)(lVar24 + 0x10) = (int)uVar11;
  goto LAB_00159574;
LAB_00159591:
  if (uVar8 == uVar4) {
    pLVar16 = ly_errno_location();
    *pLVar16 = LY_EINT;
    uVar23 = 0xbe6;
LAB_0015972e:
    ly_log(LY_LLERR,"Internal error (%s:%d).",
           "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
           ,uVar23);
    plVar9 = local_50;
    goto LAB_00159a92;
  }
  plVar30 = *(lyd_node **)(*(long *)(lVar25 + 8) + (ulong)uVar8 * 8);
  plVar26 = plVar30->child;
  if (plVar26 == (lyd_node *)0x0) {
    plStack_78 = plVar30;
  }
  *(uint *)(lVar24 + 0x10) = uVar8 + 1;
  plVar30 = local_60;
  plVar33 = local_50;
  goto LAB_00159494;
LAB_0015973e:
  ly_set_free((ly_set *)plVar33[1]);
  free(plVar33);
  plVar31 = plVar28;
  while (plVar31 != (lyd_node *)0x0) {
    plVar26 = plVar31;
    if ((char)plVar31->validity < '\0') {
      plVar31->validity = plVar31->validity & 0x7f;
LAB_001597af:
      if (((plVar31->schema->nodetype & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) &&
         (plVar30 = plVar31->child, plVar29 = plVar31, plVar30 != (lyd_node *)0x0))
      goto LAB_001597ca;
    }
    else {
      if ((local_34 == 0) && ((plVar31->field_0x9 & 1) != 0)) goto LAB_001597af;
      uVar8 = (uint)local_48;
      iVar7 = lyd_difflist_add(local_40,&local_38,uVar8,LYD_DIFF_DELETED,plVar31,(lyd_node *)0x0);
      plVar9 = (long *)0x0;
      if (iVar7 != 0) goto LAB_00159a92;
      local_48 = (ulong)(uVar8 + 1);
    }
    do {
      plVar30 = plVar26->next;
      plVar29 = plVar26;
LAB_001597ca:
      plVar31 = plVar30;
    } while ((plVar30 == (lyd_node *)0x0) &&
            (plVar26 = plVar29->parent, plVar29->parent != plVar28->parent));
  }
  for (uVar11 = 0; uVar11 < plVar10->number; uVar11 = uVar11 + 1) {
    plVar12 = (plVar10->set).s[uVar11];
    plVar27 = (lys_ext *)plVar12->ext;
    plVar17 = plVar27;
    if (*(int *)&plVar27->dsc != 0) {
      do {
        while (*(int *)&plVar27->dsc != 0) {
          lVar24 = *(long *)&plVar12->flags;
          for (uVar18 = 0;
              (uVar19 = (ulong)*(uint *)&plVar12->ref, *(uint *)&plVar12->ref != (uint)uVar18 &&
              (uVar19 = uVar18,
              (lys_ext *)*(lys_ext_instance **)(lVar24 + 0x10 + uVar18 * 0x18) != plVar27));
              uVar18 = (ulong)((uint)uVar18 + 1)) {
          }
          plVar31 = *(lyd_node **)(lVar24 + uVar19 * 0x18);
          puVar2 = (undefined8 *)(lVar24 + 8 + uVar19 * 0x18);
          plStack_98 = (lys_node *)*puVar2;
          str1 = (char *)puVar2[1];
          iVar7 = *(int *)&plVar27->dsc;
          if (iVar7 < 1) {
            while (uVar8 = (uint)uVar19, iVar7 != 0) {
              lVar25 = uVar19 * 0x18;
              uVar19 = (ulong)(uVar8 - 1);
              *(undefined8 *)(lVar24 + 0x10 + lVar25) =
                   *(undefined8 *)(lVar24 + 0x10 + uVar19 * 0x18);
              puVar2 = (undefined8 *)(lVar24 + uVar19 * 0x18);
              uVar23 = puVar2[1];
              *(undefined8 *)(lVar24 + lVar25) = *puVar2;
              ((undefined8 *)(lVar24 + lVar25))[1] = uVar23;
              lVar24 = *(long *)&plVar12->flags;
              piVar1 = (int *)(*(long *)(lVar24 + 0x10 + lVar25) + 8);
              *piVar1 = *piVar1 + -1;
              iVar7 = *(int *)&plVar27->dsc + 1;
              *(int *)&plVar27->dsc = iVar7;
            }
          }
          else {
            iVar7 = 1;
            while (uVar8 = (uint)uVar19, iVar7 != 0) {
              lVar25 = uVar19 * 0x18;
              uVar19 = (ulong)(uVar8 + 1);
              *(undefined8 *)(lVar24 + 0x10 + lVar25) =
                   *(undefined8 *)(lVar24 + 0x10 + uVar19 * 0x18);
              puVar2 = (undefined8 *)(lVar24 + uVar19 * 0x18);
              uVar23 = puVar2[1];
              *(undefined8 *)(lVar24 + lVar25) = *puVar2;
              ((undefined8 *)(lVar24 + lVar25))[1] = uVar23;
              lVar24 = *(long *)&plVar12->flags;
              piVar1 = (int *)(*(long *)(lVar24 + 0x10 + lVar25) + 8);
              *piVar1 = *piVar1 + 1;
              iVar7 = *(int *)&plVar27->dsc + -1;
              *(int *)&plVar27->dsc = iVar7;
            }
          }
          *(lyd_node **)(lVar24 + (ulong)uVar8 * 0x18) = plVar31;
          puVar2 = (undefined8 *)(lVar24 + 8 + (ulong)uVar8 * 0x18);
          *puVar2 = plStack_98;
          puVar2[1] = str1;
          if (uVar8 == 0) {
            plVar28 = (lyd_node *)0x0;
          }
          else {
            plVar28 = *(lyd_node **)(*(long *)&plVar12->flags + (ulong)(uVar8 - 1) * 0x18);
          }
          uVar8 = (uint)local_48;
          iVar7 = lyd_difflist_add(local_40,&local_38,uVar8,LYD_DIFF_MOVEDAFTER1,plVar31,plVar28);
          if (iVar7 != 0) {
            plVar9 = (long *)0x0;
            goto LAB_00159a92;
          }
          local_48 = (ulong)(uVar8 + 1);
          plVar27 = (lys_ext *)plVar27->name;
          plVar17 = plVar27;
        }
        plVar27 = (lys_ext *)plVar27->name;
      } while (plVar27 != plVar17);
    }
  }
  diff_ordset_free(plVar10);
  plVar6 = local_40;
  uVar11 = local_48;
  iVar7 = (int)local_68;
  if (iVar7 == 0) goto LAB_001599e3;
  uVar8 = iVar7 + (int)local_48 + 1;
  if (uVar8 < local_38) {
LAB_0015998b:
    plVar5 = local_58;
    uVar11 = uVar11 & 0xffffffff;
    memcpy(plVar6->type + uVar11,local_58->type,(ulong)(iVar7 + 1) * 4);
    __n = (ulong)(iVar7 + 1) << 3;
    memcpy(plVar6->first + uVar11,plVar5->first,__n);
    memcpy(plVar6->second + uVar11,plVar5->second,__n);
LAB_001599e3:
    lyd_free_diff(local_58);
    ly_err_clean(1);
    return plVar6;
  }
  local_38 = uVar8;
  pLVar20 = (LYD_DIFFTYPE *)realloc(local_40->type,(ulong)uVar8 << 2);
  if (pLVar20 != (LYD_DIFFTYPE *)0x0) {
    plVar6->type = pLVar20;
    pplVar21 = (lyd_node **)realloc(plVar6->first,(ulong)local_38 << 3);
    if (pplVar21 != (lyd_node **)0x0) {
      plVar6->first = pplVar21;
      pplVar21 = (lyd_node **)realloc(plVar6->second,(ulong)local_38 << 3);
      if (pplVar21 != (lyd_node **)0x0) {
        plVar6->second = pplVar21;
        goto LAB_0015998b;
      }
    }
  }
  pLVar16 = ly_errno_location();
  *pLVar16 = LY_EMEM;
  ly_log(LY_LLERR,"Memory allocation failed (%s()).","lyd_diff");
  plVar10 = (ly_set *)0x0;
  plVar9 = (long *)0x0;
LAB_00159a92:
  while (plVar9 != (long *)0x0) {
    plVar33 = (long *)*plVar9;
    ly_set_free((ly_set *)plVar9[1]);
    free(plVar9);
    plVar9 = plVar33;
  }
  diff_ordset_free(plVar10);
  lyd_free_diff(local_40);
  lyd_free_diff(local_58);
  return (lyd_difflist *)0x0;
}

Assistant:

lyd_difflist *
lyd_diff(struct lyd_node *first, struct lyd_node *second, int options)
{
    int rc;
    struct lyd_node *elem1, *elem2, *iter, *aux, *parent = NULL, *next1, *next2;
    struct lyd_difflist *result, *result2 = NULL;
    void *new;
    unsigned int size, size2, index = 0, index2 = 0, i, j, k;
    struct matchlist_s {
        struct matchlist_s *prev;
        struct ly_set *match;
        unsigned int i;
    } *matchlist = NULL, *mlaux;
    struct ly_set *ordset = NULL;
    struct diff_ordered *ordered;
    struct diff_ordered_dist *dist_aux, *dist_iter;
    struct diff_ordered_item item_aux;

    if (!first) {
        /* all nodes in second were created,
         * but the second must be top level */
        if (second && second->parent) {
            LOGERR(LY_EINVAL, "%s: \"first\" parameter is NULL and \"second\" is not top level.", __func__);
            return NULL;
        }
        result = lyd_diff_init_difflist(&size);
        LY_TREE_FOR(second, iter) {
            if (!iter->dflt || (options & LYD_DIFFOPT_WITHDEFAULTS)) { /* skip the implicit nodes */
                if (lyd_difflist_add(result, &size, index++, LYD_DIFF_CREATED, NULL, iter)) {
                    goto error;
                }
            }
            if (options & LYD_DIFFOPT_NOSIBLINGS) {
                break;
            }
        }
        return result;
    } else if (!second) {
        /* all nodes from first were deleted */
        result = lyd_diff_init_difflist(&size);
        LY_TREE_FOR(first, iter) {
            if (!iter->dflt || (options & LYD_DIFFOPT_WITHDEFAULTS)) { /* skip the implicit nodes */
                if (lyd_difflist_add(result, &size, index++, LYD_DIFF_DELETED, iter, NULL)) {
                    goto error;
                }
            }
            if (options & LYD_DIFFOPT_NOSIBLINGS) {
                break;
            }
        }
        return result;
    }

    if (options & LYD_DIFFOPT_NOSIBLINGS) {
        /* both trees must start at the same (schema) node */
        if (first->schema != second->schema) {
            LOGERR(LY_EINVAL, "%s: incompatible trees to compare with LYD_OPT_NOSIBLINGS option.", __func__);
            return NULL;
        }
        /* use first's and second's child to make comparison the same as without LYD_OPT_NOSIBLINGS */
        first = first->child;
        second = second->child;
    } else {
        /* go to the first sibling in both trees */
        if (first->parent) {
            first = first->parent->child;
        } else {
            while (first->prev->next) {
                first = first->prev;
            }
        }

        if (second->parent) {
            second = second->parent->child;
        } else {
            for (; second->prev->next; second = second->prev);
        }

        /* check that both has the same (schema) parent or that they are top-level nodes */
        if ((first->parent && second->parent && first->parent->schema != second->parent->schema) ||
                (!first->parent && first->parent != second->parent)) {
            LOGERR(LY_EINVAL, "%s: incompatible trees with different parents.", __func__);
            return NULL;
        }
    }
    if (first == second) {
        LOGERR(LY_EINVAL, "%s: comparing the same tree does not make sense.", __func__);
        return NULL;
    }

    /* initiate resulting structure */
    result = lyd_diff_init_difflist(&size);

    /* the records about created and moved items are created in
     * bad order, so the records about created nodes (and their
     * possible moving) is stored separately and added to the
     * main result at the end.
     */
    result2 = lyd_diff_init_difflist(&size2);

    matchlist = malloc(sizeof *matchlist);
    matchlist->i = 0;
    matchlist->match = ly_set_new();
    matchlist->prev = NULL;

    ordset = ly_set_new();

    /*
     * compare trees
     */
    /* 1) newly created nodes + changed leafs/anyxmls */
    next1 = first;
    for (elem2 = next2 = second; elem2; elem2 = next2) {
        /* keep right pointer for searching in the first tree */
        elem1 = next1;

        if (elem2->dflt && !(options & LYD_DIFFOPT_WITHDEFAULTS)) {
            /* skip default elements, they could not be created or changed, just deleted */
            goto cmp_continue;
        }

        /* search for elem2 instance in the first */
        LY_TREE_FOR(elem1, iter) {
            if (iter->schema != elem2->schema) {
                continue;
            }

            /* elem2 instance found */
            rc = lyd_diff_compare(iter, elem2, result, &size, &index, matchlist->match, ordset, options);
            if (rc == -1) {
                goto error;
            } else if (rc == 0) {
                /* match */
                break;
            } /* else, continue */
        }

        if (!iter) {
            /* elem2 not found in the first tree */
            if (lyd_difflist_add(result2, &size2, index2++, LYD_DIFF_CREATED, elem1 ? elem1->parent : parent, elem2)) {
                goto error;
            }

            if (elem1 && (elem2->schema->flags & LYS_USERORDERED)) {
                /* store the correct place where the node is supposed to be moved after creation */
                /* if elem1 does not exist, all nodes were created and they will be created in
                 * correct order, so it is not needed to detect moves */
                for (aux = elem2->prev; aux->next; aux = aux->prev) {
                    if (aux->schema == elem2->schema) {
                        /* predecessor found */
                        break;
                    }
                }
                if (!aux->next) {
                    /* predecessor not found */
                    aux = NULL;
                }
                if (lyd_difflist_add(result2, &size2, index2++, LYD_DIFF_MOVEDAFTER2, aux, elem2)) {
                    goto error;
                }
            }
        }

cmp_continue:
        /* select element for the next run                                    1     2
         * - first, process all siblings of a single parent                  / \   / \
         * - then, go to children (deep)                                    3   4 7   8
         * - return to the parent's next sibling children                  / \
         *                                                                5   6
         */
        /* siblings first */
        next1 = elem1;
        next2 = elem2->next;

        if (!next2) {
            /* children */

            /* first pass of the siblings done, some additional work for future
             * detection of move may be needed */
            for (i = ordset->number; i > 0; i--) {
                ordered = (struct diff_ordered *)ordset->set.g[i - 1];
                if (ordered->items) {
                    /* already preprocessed ordered structure */
                    break;
                }
                ordered->items = calloc(ordered->count, sizeof *ordered->items);
                ordered->dist = NULL;
                /* zero the count to be used as a node position in lyd_diff_move_preprocess() */
                ordered->count = 0;
            }

            /* first, get the first sibling */
            if (elem2->parent == second->parent) {
                elem2 = second;
            } else {
                elem2 = elem2->parent->child;
            }

            /* and then find the first child */
            for (iter = elem2; iter; iter = iter->next) {
                if (!(iter->validity & LYD_VAL_INUSE)) {
                    /* the iter is not present in both trees */
                    continue;
                } else if (matchlist->i == matchlist->match->number) {
                    if (iter == elem2) {
                        /* we already went through all the matching nodes and now we are just supposed to stop
                         * the loop with no iter */
                        iter = NULL;
                        break;
                    } else {
                        /* we have started with some not processed data in matchlist, but now we have
                         * the INUSE iter and no nodes in matchlist to find its equivalent,
                         * so something went wrong somewhere */
                        LOGINT;
                        goto error;
                    }
                }

                iter->validity &= ~LYD_VAL_INUSE;
                if ((iter->schema->nodetype & (LYS_LEAFLIST | LYS_LIST)) && (iter->schema->flags & LYS_USERORDERED)) {
                    for (j = ordset->number; j > 0; j--) {
                        ordered = (struct diff_ordered *)ordset->set.g[j - 1];
                        if (ordered->schema != iter->schema || !lyd_diff_equivnode(ordered->parent, iter->parent)) {
                            continue;
                        }

                        /* store necessary information for move detection */
                        lyd_diff_move_preprocess(ordered, matchlist->match->set.d[matchlist->i], iter);
                        break;
                    }
                }

                if ((iter->schema->nodetype & (LYS_CONTAINER | LYS_LIST)) && iter->child) {
                    while (matchlist->i < matchlist->match->number && matchlist->match->set.d[matchlist->i]->schema != iter->schema) {
                        matchlist->i++;
                    }
                    if (matchlist->i == matchlist->match->number) {
                        /* we have the INUSE iter, so we have to find its equivalent in match list */
                        LOGINT;
                        goto error;
                    }
                    next1 = matchlist->match->set.d[matchlist->i]->child;
                    if (!next1) {
                        parent = matchlist->match->set.d[matchlist->i];
                    }
                    matchlist->i++;
                    next2 = iter->child;
                    break;
                }
                matchlist->i++;
            }

            if (!iter) {
                /* no child/data on next level */
                if (elem2 == second) {
                    /* done */
                    break;
                }
            } else {
                /* create new matchlist item */
                mlaux = malloc(sizeof *mlaux);
                mlaux->i = 0;
                mlaux->match = ly_set_new();
                mlaux->prev = matchlist;
                matchlist = mlaux;
            }
        }

        while (!next2) {
            /* parent */

            /* clean the last match set */
            ly_set_clean(matchlist->match);
            matchlist->i = 0;

            /* try to go to a cousin - child of the next parent's sibling */
            mlaux = matchlist->prev;
            for (iter = elem2->parent->next; iter; iter = iter->next) {
                if (!(iter->validity & LYD_VAL_INUSE)) {
                    continue;
                } else if (mlaux->i == mlaux->match->number) {
                    if (iter == elem2->parent->next) {
                        /* we already went through all the matching nodes and now we are just supposed to stop
                         * the loop with no iter */
                        iter = NULL;
                        break;
                    } else {
                        /* we have started with some not processed data in matchlist, but now we have
                         * the INUSE iter and no nodes in matchlist to find its equivalent,
                         * so something went wrong somewhere */
                        LOGINT;
                        goto error;
                    }
                }

                iter->validity &= ~LYD_VAL_INUSE;
                if ((iter->schema->nodetype & (LYS_LEAFLIST | LYS_LIST)) && (iter->schema->flags & LYS_USERORDERED)) {
                    for (j = ordset->number ; j > 0; j--) {
                        ordered = (struct diff_ordered *)ordset->set.g[j - 1];
                        if (ordered->schema != iter->schema || !lyd_diff_equivnode(ordered->parent, iter->parent)) {
                            continue;
                        }

                        /* store necessary information for move detection */
                        lyd_diff_move_preprocess(ordered, mlaux->match->set.d[mlaux->i], iter);
                        break;
                    }
                }

                if ((iter->schema->nodetype & (LYS_CONTAINER | LYS_LIST)) && iter->child) {
                    while (mlaux->i < mlaux->match->number && mlaux->match->set.d[mlaux->i]->schema != iter->schema) {
                        mlaux->i++;
                    }
                    if (mlaux->i == mlaux->match->number) {
                        /* we have the INUSE iter, so we have to find its equivalent in match list */
                        LOGINT;
                        goto error;
                    }
                    next1 = mlaux->match->set.d[mlaux->i]->child;
                    if (!next1) {
                        parent = mlaux->match->set.d[mlaux->i];
                    }
                    mlaux->i++;
                    next2 = iter->child;
                    break;
                }
                mlaux->i++;
            }

            /* if no cousin exists, continue next loop on higher level */
            if (!iter) {
                elem2 = elem2->parent;

                /* remove matchlist item */
                ly_set_free(matchlist->match);
                mlaux = matchlist;
                matchlist = matchlist->prev;
                free(mlaux);

                if (!matchlist->prev) { /* elem2->parent == second->parent */
                    /* done */
                    break;
                }
            }
        }
    }

    ly_set_free(matchlist->match);
    free(matchlist);
    matchlist = NULL;


    /* 2) deleted nodes */
    LY_TREE_DFS_BEGIN(first, next1, elem1) {
        /* search for elem1s deleted in the second */
        if (elem1->validity & LYD_VAL_INUSE) {
            /* erase temporary LYD_VAL_INUSE flag and continue into children */
            elem1->validity &= ~LYD_VAL_INUSE;
        } else if (!elem1->dflt || (options & LYD_DIFFOPT_WITHDEFAULTS)) {
            /* elem1 has no matching node in second, add it into result */
            if (lyd_difflist_add(result, &size, index++, LYD_DIFF_DELETED, elem1, NULL)) {
                goto error;
            }

            /* skip subtree processing of data missing in the second tree */
            goto dfs_nextsibling;
        }

        /* modified LY_TREE_DFS_END() */
        /* select element for the next run - children first */
        if (elem1->schema->nodetype & (LYS_LEAF | LYS_LEAFLIST | LYS_ANYDATA)) {
            next1 = NULL;
        } else {
            next1 = elem1->child;
        }
        if (!next1) {
dfs_nextsibling:
            /* try siblings */
            next1 = elem1->next;
        }
        while (!next1) {
            /* parent is already processed, go to its sibling */

            elem1 = elem1->parent;
            if (elem1 == first->parent) {
                /* we are done, no next element to process */
                break;
            }

            next1 = elem1->next;
        }
    }

    /* 3) moved nodes (when user-ordered) */
    for (i = 0; i < ordset->number; i++) {
        ordered = (struct diff_ordered *)ordset->set.g[i];
        if (!ordered->dist->dist) {
            /* the dist list is sorted here, but the biggest dist is 0,
             * so nothing changed in order of these items between first
             * and second. We can continue with another user-ordered list.
             */
            continue;
        }

        /* get needed movements
         * - from the biggest distances try to apply node movements
         * on first tree node until they will be ordered as in the
         * second tree - i.e. until there will be no position difference
         */

        for (dist_iter = ordered->dist; ; dist_iter = dist_iter->next) {
            /* dist list is sorted at the beginning, since applying a move causes
             * just a small change in other distances, we assume that the biggest
             * dist is the next one (note that dist list is implemented as ring
             * list). This way we avoid sorting distances after each move. The loop
             * stops when all distances are zero.
             */
            dist_aux = dist_iter;
            while (!dist_iter->dist) {
                /* no dist, so no move. Try another, but when
                 * there is no dist at all, stop the loop
                 */
                dist_iter = dist_iter->next;
                if (dist_iter == dist_aux) {
                    /* all dist we zeroed */
                    goto movedone;
                }
            }
            /* something to move */

            /* get the item to move */
            for (k = 0; k < ordered->count; k++) {
                if (ordered->items[k].dist == dist_iter) {
                    break;
                }
            }

            /* apply the move (distance) */
            memcpy(&item_aux, &ordered->items[k], sizeof item_aux);
            if (dist_iter->dist > 0) {
                /* move to right (other move to left) */
                while (dist_iter->dist) {
                    memcpy(&ordered->items[k], &ordered->items[k + 1], sizeof *ordered->items);
                    ordered->items[k].dist->dist++; /* update moved item distance */
                    dist_iter->dist--;
                    k++;
                }
            } else {
                /* move to left (other move to right) */
                while (dist_iter->dist) {
                    memcpy(&ordered->items[k], &ordered->items[k - 1], sizeof *ordered->items);
                    ordered->items[k].dist->dist--; /* update moved item distance */
                    dist_iter->dist++;
                    k--;
                }
            }
            memcpy(&ordered->items[k], &item_aux, sizeof *ordered->items);

            /* store the transaction into the difflist */
            if (lyd_difflist_add(result, &size, index++, LYD_DIFF_MOVEDAFTER1, item_aux.first,
                                 (k > 0) ? ordered->items[k - 1].first : NULL)) {
                goto error;
            }
            continue;

movedone:
            break;
        }
    }

    diff_ordset_free(ordset);
    ordset = NULL;

    if (index2) {
        /* append result2 with newly created
         * (and possibly moved) nodes */
        if (index + index2 + 1 >= size) {
            /* result must be enlarged */
            size = index + index2 + 1;
            new = realloc(result->type, size * sizeof *result->type);
            if (!new) {
                LOGMEM;
                goto error;
            }
            result->type = new;

            new = realloc(result->first, size * sizeof *result->first);
            if (!new) {
                LOGMEM;
                goto error;
            }
            result->first = new;

            new = realloc(result->second, size * sizeof *result->second);
            if (!new) {
                LOGMEM ;
                goto error;
            }
            result->second = new;
        }

        /* append */
        memcpy(&result->type[index], result2->type, (index2 + 1) * sizeof *result->type);
        memcpy(&result->first[index], result2->first, (index2 + 1) * sizeof *result->first);
        memcpy(&result->second[index], result2->second, (index2 + 1) * sizeof *result->second);
    }
    lyd_free_diff(result2);

    ly_err_clean(1);
    return result;

error:

    while (matchlist) {
        mlaux = matchlist;
        matchlist = mlaux->prev;
        ly_set_free(mlaux->match);
        free(mlaux);

    }
    diff_ordset_free(ordset);

    lyd_free_diff(result);
    lyd_free_diff(result2);

    return NULL;
}